

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

TimerHolder __thiscall Liby::TimerQueue::insert(TimerQueue *this,Timer *timer)

{
  Logger *this_00;
  undefined8 *puVar1;
  long *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  double __x;
  TimerHolder TVar2;
  WeakTimerHolder weak_holder;
  
  this_00 = Logger::getLogger();
  Logger::log(this_00,__x);
  if (*in_RDX != 0) {
    if (*(int *)&(timer->handler_).super__Function_base._M_manager == 0) {
      updateTimerfd((TimerQueue *)timer,(Timestamp *)(in_RDX + 1));
    }
    std::make_shared<Liby::Timer,Liby::Timer_const&>((Timer *)this);
    WeakTimerHolder::WeakTimerHolder(&weak_holder,(TimerHolder *)this);
    BinaryHeap<Liby::WeakTimerHolder>::insert
              ((BinaryHeap<Liby::WeakTimerHolder> *)
               &(timer->handler_).super__Function_base._M_manager,&weak_holder);
    WeakTimerHolder::~WeakTimerHolder(&weak_holder);
    TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (TimerHolder)TVar2.timerPtr_.super___shared_ptr<Liby::Timer,_(__gnu_cxx::_Lock_policy)2>;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar1 = "timer id will not be zero";
  __cxa_throw(puVar1,&char_const*::typeinfo,0);
}

Assistant:

TimerHolder TimerQueue::insert(const Timer &timer) {
    verbose("add timer id = %lu", timer.id());
    if (timer.id() == 0) // ignore all timer which id is zero
        throw "timer id will not be zero";

    if (queue_.empty()) {
        updateTimerfd(timer.timeout());
    }

    TimerHolder holder(timer);
    WeakTimerHolder weak_holder(holder);
    queue_.insert(weak_holder);
    return holder;
}